

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ReadBinaryFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              string *file)

{
  runtime_error *this;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [4];
  int aiStack_208 [50];
  undefined8 auStack_140 [36];
  
  std::ifstream::ifstream(local_228,(string *)file,_S_bin);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) == 0) {
    __first._8_8_ = 0xffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_140 + *(long *)(local_228[0] + -0x18));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,(istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
               (allocator_type *)&local_248);
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Failed to open file: ","");
  std::operator+(&local_248,&local_268,file);
  std::runtime_error::runtime_error(this,(string *)&local_248);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<uint8_t> ReadBinaryFile(std::string const& file) {
  std::ifstream in(file, std::ios_base::binary);
  if (!in.good()) {
    throw std::runtime_error("Failed to open file: "s + file);
  }

  return std::vector<uint8_t>(std::istreambuf_iterator<char>(in),
                              std::istreambuf_iterator<char>());
}